

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall google::protobuf::io::Printer::push_back(Printer *this,char c)

{
  char *pcVar1;
  bool bVar2;
  char in_SIL;
  Printer *in_RDI;
  
  if (((in_RDI->failed_ & 1U) == 0) &&
     ((in_RDI->buffer_size_ != 0 || (bVar2 = Next(in_RDI), bVar2)))) {
    pcVar1 = in_RDI->buffer_;
    in_RDI->buffer_ = pcVar1 + 1;
    *pcVar1 = in_SIL;
    in_RDI->buffer_size_ = in_RDI->buffer_size_ + -1;
    in_RDI->offset_ = in_RDI->offset_ + 1;
  }
  return;
}

Assistant:

void push_back(char c) {
    if (failed_) return;
    if (buffer_size_ == 0) {
      if (!Next()) return;
    }
    *buffer_++ = c;
    buffer_size_--;
    offset_++;
  }